

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O3

void __thiscall
duckdb::AlpRDScanState<float>::LoadVector<true>
          (AlpRDScanState<float> *this,EXACT_TYPE *value_buffer)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  int remainder;
  uint val;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  data_ptr_t pdVar10;
  
  (this->vector_state).index = 0;
  pdVar10 = this->metadata_ptr;
  this->metadata_ptr = pdVar10 + -4;
  uVar7 = this->count - this->total_value_count;
  if (0x3ff < uVar7) {
    uVar7 = 0x400;
  }
  puVar1 = (uint16_t *)(this->segment_data + *(uint *)(pdVar10 + -4));
  (this->vector_state).exceptions_count = *puVar1;
  bVar2 = (this->vector_state).left_bit_width;
  val = (uint)uVar7 & 0x1f;
  if ((uVar7 & 0x1f) == 0) {
    bVar6 = (this->vector_state).right_bit_width;
    uVar9 = uVar7;
  }
  else {
    lVar8 = uVar7 + 0x20;
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    bVar6 = (this->vector_state).right_bit_width;
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    uVar7 = lVar8 - uVar5;
    uVar9 = lVar8 - uVar4;
  }
  uVar9 = bVar2 * uVar9 >> 3;
  uVar7 = bVar6 * uVar7 >> 3;
  switchD_012bc561::default((this->vector_state).left_encoded,puVar1 + 1,uVar9);
  pdVar10 = (data_ptr_t)(uVar9 + (long)(puVar1 + 1));
  switchD_012bc561::default((this->vector_state).right_encoded,pdVar10,uVar7);
  uVar3 = (this->vector_state).exceptions_count;
  if (uVar3 != 0) {
    pdVar10 = pdVar10 + uVar7;
    switchD_012bc561::default((this->vector_state).exceptions,pdVar10,(ulong)((uint)uVar3 * 2));
    uVar7 = (ulong)((uint)(this->vector_state).exceptions_count * 2);
    switchD_012bc561::default((this->vector_state).exceptions_positions,pdVar10 + uVar7,uVar7);
    return;
  }
  return;
}

Assistant:

void LoadVector(EXACT_TYPE *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpRDConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpRDConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpRDConstants::EXCEPTIONS_COUNT_SIZE;
		D_ASSERT(vector_state.exceptions_count <= vector_size);

		auto left_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.left_bit_width);
		auto right_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.right_bit_width);

		memcpy(vector_state.left_encoded, (void *)vector_ptr, left_bp_size);
		vector_ptr += left_bp_size;

		memcpy(vector_state.right_encoded, (void *)vector_ptr, right_bp_size);
		vector_ptr += right_bp_size;

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count);
			vector_ptr += AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}